

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_history(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  v9 *in_RDI;
  string buffer;
  bool found;
  int len;
  CHAR_DATA *victim;
  char obuf [4608];
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffb6b8;
  CHAR_DATA *in_stack_ffffffffffffb6c0;
  undefined1 *puVar6;
  CHAR_DATA *in_stack_ffffffffffffb6c8;
  char *in_stack_ffffffffffffb6d0;
  char *in_stack_ffffffffffffb6e8;
  string local_4908 [35];
  byte local_48e5;
  int local_48e4;
  CHAR_DATA *local_48e0;
  char local_48d8 [504];
  format_args in_stack_ffffffffffffb920;
  string_view in_stack_ffffffffffffb930;
  char local_36d8 [4504];
  char *in_stack_ffffffffffffdac0;
  CHAR_DATA *in_stack_ffffffffffffdac8;
  char *in_stack_ffffffffffffdad0;
  CHAR_DATA *in_stack_ffffffffffffdad8;
  CHAR_DATA *in_stack_ffffffffffffdae0;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_24d8 [576];
  char *local_d8;
  v9 *local_d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_c8 [3]
  ;
  undefined8 local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_a8;
  char *local_a0;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_90;
  undefined1 local_88 [16];
  string *local_78;
  char *local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_10;
  char *local_8;
  
  local_48e5 = 0;
  local_d0 = in_RDI;
  local_d8 = one_argument((char *)in_stack_ffffffffffffb6c0,(char *)in_stack_ffffffffffffb6b8);
  local_d8 = one_argument((char *)in_stack_ffffffffffffb6c0,(char *)in_stack_ffffffffffffb6b8);
  if ((bool)local_24d8[0]._0_1_ == false) {
    send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
    send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
    send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
    send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
    send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
    send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
  }
  else {
    local_48e0 = get_char_world(in_stack_ffffffffffffdac8,in_stack_ffffffffffffdac0);
    if (local_48e0 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
      puVar6 = &stack0xffffffffffffb6e8;
      local_70 = "finger {} history";
      local_60 = "finger {} history";
      pcVar4 = "finger {} history";
      local_68 = puVar6;
      local_58 = puVar6;
      sVar3 = std::char_traits<char>::length((char_type *)0x59aedb);
      *(size_t *)(puVar6 + 8) = sVar3;
      local_8 = local_70;
      local_78 = local_4908;
      local_90 = local_24d8;
      local_50 = local_88;
      local_a0 = pcVar4;
      local_48 = pcVar4;
      local_c8[0] = fmt::v9::
                    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                              ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
                                *)&local_90->string,local_d0,(char (*) [4608])local_78);
      local_30 = &local_b0;
      local_38 = local_c8;
      local_20 = 0xc;
      local_b0 = 0xc;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      local_a8 = local_38;
      fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb930,in_stack_ffffffffffffb920);
      std::__cxx11::string::data();
      interpret((CHAR_DATA *)arg2._4536_8_,(char *)arg2._4528_8_);
      std::__cxx11::string::~string(local_4908);
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffb6b8);
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
      }
      else {
        if ((*(short *)(local_d0 + 0x138) <= local_48e0->level) &&
           (iVar2 = get_trust(in_stack_ffffffffffffb6b8), iVar2 < 0x3c)) {
          send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
          return;
        }
        if (local_36d8[0] == '\0') {
          show_history(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8);
        }
        else {
          iVar2 = strcmp(local_36d8,"clear");
          if (iVar2 == 0) {
            bVar1 = IS_IMP(in_stack_ffffffffffffb6b8);
            if (!bVar1) {
              send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
              return;
            }
            local_48e0->pcdata->history_buffer = (char *)0x0;
          }
          iVar2 = strcmp(local_36d8,"add");
          if (iVar2 == 0) {
            if ((local_48e0->pcdata->temp_history_buffer == (char *)0x0) ||
               (*local_48e0->pcdata->temp_history_buffer == '\0')) {
              send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
            }
            else {
              add_history(in_stack_ffffffffffffdae0,in_stack_ffffffffffffdad8,
                          in_stack_ffffffffffffdad0);
              free_pstring((char *)in_stack_ffffffffffffb6c0);
              local_48e0->pcdata->temp_history_buffer = (char *)0x0;
              show_history(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8);
            }
          }
          else {
            iVar2 = strcmp(local_36d8,"show");
            if (iVar2 == 0) {
              show_temp_history(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8);
            }
            else {
              iVar2 = strcmp(local_36d8,"+");
              if (iVar2 == 0) {
                if (*local_d8 == '\0') {
                  send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
                  return;
                }
                local_48d8[0] = '\0';
                if (local_48e0->pcdata->temp_history_buffer != (char *)0x0) {
                  strcat(local_48d8,local_48e0->pcdata->temp_history_buffer);
                }
                smash_tilde(local_d8);
                strcat(local_48d8,local_d8);
                strcat(local_48d8,"\n\r");
                free_pstring((char *)in_stack_ffffffffffffb6c0);
                pcVar4 = palloc_string(in_stack_ffffffffffffb6e8);
                local_48e0->pcdata->temp_history_buffer = pcVar4;
                show_temp_history(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8);
              }
              iVar2 = strcmp(local_36d8,"-");
              if (iVar2 == 0) {
                if ((local_48e0->pcdata->temp_history_buffer == (char *)0x0) ||
                   (*local_48e0->pcdata->temp_history_buffer == '\0')) {
                  send_to_char(in_stack_ffffffffffffb6d0,in_stack_ffffffffffffb6c8);
                }
                else {
                  strcpy(local_48d8,local_48e0->pcdata->temp_history_buffer);
                  sVar5 = strlen(local_48d8);
                  for (local_48e4 = (int)sVar5; 0 < local_48e4; local_48e4 = local_48e4 + -1) {
                    if (local_48d8[local_48e4] == '\r') {
                      if ((local_48e5 & 1) != 0) {
                        local_48d8[local_48e4 + 1] = '\0';
                        free_pstring((char *)in_stack_ffffffffffffb6c0);
                        pcVar4 = palloc_string(in_stack_ffffffffffffb6e8);
                        local_48e0->pcdata->temp_history_buffer = pcVar4;
                        show_temp_history(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8);
                        return;
                      }
                      if (0 < local_48e4) {
                        local_48e4 = local_48e4 + -1;
                      }
                      local_48e5 = 1;
                    }
                  }
                  local_48d8[0] = '\0';
                  free_pstring((char *)in_stack_ffffffffffffb6c0);
                  pcVar4 = palloc_string(in_stack_ffffffffffffb6e8);
                  local_48e0->pcdata->temp_history_buffer = pcVar4;
                  show_temp_history(in_stack_ffffffffffffb6c0,in_stack_ffffffffffffb6b8);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_history(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_STRING_LENGTH];
	char arg2[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int len;
	bool found = false;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: history <character>          = read a character's history\n\r", ch);
		send_to_char("        history <character> + <info> = add to the temporary buffer\n\r", ch);
		send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r", ch);
		send_to_char("        history <character> show     = shows the temporary buffer\n\r", ch);
		send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r", ch);
		send_to_char("        history <character> clear    = clear a player's history (IMP ONLY)\n\r", ch);
		return;
	}

	victim = get_char_world(ch,arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here, attempting offline history...\n\r", ch);
		auto buffer = fmt::format("finger {} history", arg1);
		interpret(ch, buffer.data());
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("You can't history a mob.\n\r", ch);
		return;
	}

	if (victim->level >= ch->level && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		show_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "clear"))
	{
		if (!IS_IMP(ch))
		{
			send_to_char("You are not permitted to complete that operation.\n\r", ch);
			return;
		}

		victim->pcdata->history_buffer = nullptr;
	}

	if (!strcmp(arg2, "add"))
	{
		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("The temporary buffer for that character is empty.\n\r", ch);
			return;
		}
		else
		{
			add_history(ch, victim, victim->pcdata->temp_history_buffer);

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = nullptr;

			show_history(ch, victim);
		}

		return;
	}

	if (!strcmp(arg2, "show"))
	{
		show_temp_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "+"))
	{
		if (argument[0] != '\0')
		{
			obuf[0] = '\0';
			if (victim->pcdata->temp_history_buffer)
			{
				strcat(obuf, victim->pcdata->temp_history_buffer);
			}
			smash_tilde(argument);
			strcat(obuf, argument);
			strcat(obuf, "\n\r");

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = palloc_string(obuf);
		}
		else
		{
			send_to_char("Add what?\n\r", ch);
			return;
		}

		show_temp_history(ch, victim);
	}

	if (!strcmp(arg2, "-"))
	{

		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("No lines left to remove.\n\r", ch);
			return;
		}

		strcpy(obuf, victim->pcdata->temp_history_buffer);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
					{
						len--;
					}
					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';
					free_pstring(victim->pcdata->temp_history_buffer);
					victim->pcdata->temp_history_buffer = palloc_string(obuf);
					show_temp_history(ch, victim);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(victim->pcdata->temp_history_buffer);
		victim->pcdata->temp_history_buffer = palloc_string(obuf);

		show_temp_history(ch, victim);
	}
}